

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O3

char * ngx_conf_set_access_slot(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  ngx_uint_t nVar1;
  ngx_array_t *pnVar2;
  void *pvVar3;
  char *__s1;
  int iVar4;
  long lVar5;
  sbyte sVar6;
  char *confp;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong local_38;
  
  nVar1 = cmd->offset;
  if (*(long *)((long)conf + nVar1) != -1) {
    return "is duplicate";
  }
  pnVar2 = cf->args;
  pvVar3 = pnVar2->elts;
  *(undefined8 *)((long)conf + nVar1) = 0;
  uVar9 = 0x180;
  if (1 < pnVar2->nelts) {
    uVar7 = 1;
    local_38 = 0x180;
    uVar9 = 0;
    do {
      __s1 = *(char **)((long)pvVar3 + 0x18);
      lVar8 = 5;
      iVar4 = strncmp(__s1,"user:",5);
      if (iVar4 == 0) {
        sVar6 = 6;
        local_38 = 0;
      }
      else {
        lVar8 = 6;
        iVar4 = strncmp(__s1,"group:",6);
        if (iVar4 == 0) {
          sVar6 = 3;
        }
        else {
          lVar8 = 4;
          iVar4 = strncmp(__s1,"all:",4);
          if (iVar4 != 0) goto LAB_0011acc9;
          sVar6 = 0;
        }
      }
      if (__s1[lVar8] != 'r') {
LAB_0011acc9:
        ngx_conf_log_error(1,cf,0,"invalid value \"%V\"",(void *)((long)pvVar3 + 0x10));
        return (char *)0xffffffffffffffff;
      }
      if ((__s1[lVar8 + 1] == 'w') && (__s1[lVar8 + 2] == '\0')) {
        lVar5 = 6;
      }
      else {
        lVar5 = 4;
        if (__s1[lVar8 + 1] != '\0') goto LAB_0011acc9;
      }
      uVar9 = uVar9 | lVar5 << sVar6;
      *(ulong *)((long)conf + nVar1) = uVar9;
      uVar7 = uVar7 + 1;
      pvVar3 = (void *)((long)pvVar3 + 0x10);
    } while (uVar7 < pnVar2->nelts);
    uVar9 = uVar9 | local_38;
  }
  *(ulong *)((long)conf + nVar1) = uVar9;
  return (char *)0x0;
}

Assistant:

char *
ngx_conf_set_access_slot(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    char  *confp = conf;

    u_char      *p;
    ngx_str_t   *value;
    ngx_uint_t   i, right, shift, *access, user;

    access = (ngx_uint_t *) (confp + cmd->offset);

    if (*access != NGX_CONF_UNSET_UINT) {
        return "is duplicate";
    }

    value = cf->args->elts;

    *access = 0;
    user = 0600;

    for (i = 1; i < cf->args->nelts; i++) {

        p = value[i].data;

        if (ngx_strncmp(p, "user:", sizeof("user:") - 1) == 0) {
            shift = 6;
            p += sizeof("user:") - 1;
            user = 0;

        } else if (ngx_strncmp(p, "group:", sizeof("group:") - 1) == 0) {
            shift = 3;
            p += sizeof("group:") - 1;

        } else if (ngx_strncmp(p, "all:", sizeof("all:") - 1) == 0) {
            shift = 0;
            p += sizeof("all:") - 1;

        } else {
            goto invalid;
        }

        if (ngx_strcmp(p, "rw") == 0) {
            right = 6;

        } else if (ngx_strcmp(p, "r") == 0) {
            right = 4;

        } else {
            goto invalid;
        }

        *access |= right << shift;
    }

    *access |= user;

    return NGX_CONF_OK;

invalid:

    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0, "invalid value \"%V\"", &value[i]);

    return NGX_CONF_ERROR;
}